

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmFuncts.cpp
# Opt level: O1

string * AsmFuncts::getFuncCode(string *__return_storage_ptr__,string *op)

{
  size_t __n;
  size_t sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer ppVar7;
  ulong uVar8;
  bool bVar9;
  
  bVar9 = (long)Codes::typeROp_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)Codes::typeROp_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0;
  if (bVar9) {
    uVar4 = (long)Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    __n = op->_M_string_length;
    uVar8 = 1;
    ppVar7 = Codes::typeROp_abi_cxx11_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar1 = (ppVar7->second)._M_string_length;
      if ((__n == sVar1) &&
         ((__n == 0 ||
          (iVar2 = bcmp((op->_M_dataplus)._M_p,(ppVar7->second)._M_dataplus._M_p,__n), iVar2 == 0)))
         ) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = (ppVar7->first)._M_dataplus._M_p;
        pcVar6 = pcVar5 + (ppVar7->first)._M_string_length;
LAB_00125a1a:
        std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar5,pcVar6);
        if (bVar9) {
          return __return_storage_ptr__;
        }
        break;
      }
      if ((__n == (ppVar7->first)._M_string_length) &&
         ((__n == 0 ||
          (iVar2 = bcmp((op->_M_dataplus)._M_p,(ppVar7->first)._M_dataplus._M_p,__n), iVar2 == 0))))
      {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = (ppVar7->second)._M_dataplus._M_p;
        pcVar6 = pcVar5 + sVar1;
        goto LAB_00125a1a;
      }
      bVar9 = uVar8 < uVar4;
      ppVar7 = ppVar7 + 1;
      lVar3 = (-(ulong)(uVar4 == 0) - uVar4) + uVar8;
      uVar8 = uVar8 + 1;
    } while (lVar3 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"000000","");
  return __return_storage_ptr__;
}

Assistant:

string AsmFuncts::getFuncCode(string op) {
    for (int i = 0; i < Codes::typeROp.size(); i++) {
        if(op == Codes::typeROp[i].second)
            return Codes::typeROp[i].first;
        if(op == Codes::typeROp[i].first)
            return Codes::typeROp[i].second;
    }
    return "000000";
}